

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeTests::init
          (SingleVertexArrayOutputTypeTests *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  SingleVertexArrayOutputTypeGroup *this_00;
  uint local_4c;
  InputType local_48;
  int inputTypeNdx;
  InputType inputTypes [11];
  SingleVertexArrayOutputTypeTests *this_local;
  
  pvVar1 = memcpy(&local_48,&DAT_0127fdb0,0x2c);
  local_4c = 0;
  while ((int)local_4c < 0xb) {
    this_00 = (SingleVertexArrayOutputTypeGroup *)operator_new(0x80);
    SingleVertexArrayOutputTypeGroup::SingleVertexArrayOutputTypeGroup
              (this_00,(this->super_TestCaseGroup).m_context,(&local_48)[(int)local_4c]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_4c = local_4c + 1;
    pvVar1 = (void *)(ulong)local_4c;
  }
  return (int)pvVar1;
}

Assistant:

void SingleVertexArrayOutputTypeTests::init (void)
{
	// Test output types with different input types, component counts and storage, Usage?, Precision?, float?
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_UNSIGNED_INT, Array::INPUTTYPE_INT, Array::INPUTTYPE_HALF, Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayOutputTypeGroup(m_context, inputTypes[inputTypeNdx]));
	}
}